

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult *
Catch::clara::detail::convertInto(ParserResult *__return_storage_ptr__,string *source,bool *target)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  size_type sVar7;
  string srcLC;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (source->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + source->_M_string_length);
  _Var2._M_p = local_90._M_dataplus._M_p;
  if (local_90._M_string_length != 0) {
    sVar7 = 0;
    do {
      iVar3 = tolower((uint)(byte)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar3;
      sVar7 = sVar7 + 1;
    } while (local_90._M_string_length != sVar7);
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_90,"y");
  bVar6 = true;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_90,"1");
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_90,"true");
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_90,"yes");
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_90,"on");
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_90,"n");
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_90,"0");
              if (iVar3 != 0) {
                iVar3 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_90,"false");
                if (iVar3 != 0) {
                  iVar3 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_90,"no");
                  if (iVar3 != 0) {
                    iVar3 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_90,"off");
                    if (iVar3 != 0) {
                      ::std::operator+(&local_50,
                                       "Expected a boolean value but did not recognise: \'",source);
                      pbVar4 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               append(&local_50,"\'");
                      local_70._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
                      paVar5 = &pbVar4->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p == paVar5) {
                        local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                        local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
                        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                      }
                      else {
                        local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                      }
                      local_70._M_string_length = pbVar4->_M_string_length;
                      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
                      pbVar4->_M_string_length = 0;
                      (pbVar4->field_2)._M_local_buf[0] = '\0';
                      BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
                                (__return_storage_ptr__,RuntimeError,&local_70);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                        operator_delete(local_70._M_dataplus._M_p,
                                        local_70.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        local_50.field_2._M_allocated_capacity + 1);
                      }
                      goto LAB_0018a0f6;
                    }
                  }
                }
              }
            }
            bVar6 = false;
          }
        }
      }
    }
  }
  *target = bVar6;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001c6878;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0018a0f6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto convertInto(std::string const &source, bool &target) -> ParserResult {
        std::string srcLC = source;
        std::transform(srcLC.begin(), srcLC.end(), srcLC.begin(), [](unsigned char c) { return static_cast<char>(std::tolower(c)); });
        if (srcLC == "y" || srcLC == "1" || srcLC == "true" || srcLC == "yes" || srcLC == "on")
          target = true;
        else if (srcLC == "n" || srcLC == "0" || srcLC == "false" || srcLC == "no" || srcLC == "off")
          target = false;
        else
          return ParserResult::runtimeError("Expected a boolean value but did not recognise: '" + source + "'");
        return ParserResult::ok(ParseResultType::Matched);
      }